

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk_draw_list_push_command(nk_draw_list *list,nk_rect clip,nk_handle texture)

{
  void *pvVar1;
  nk_size nVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  nk_size total;
  nk_byte *memory;
  nk_draw_command *cmd;
  nk_draw_list *list_local;
  nk_handle texture_local;
  nk_rect clip_local;
  
  uVar4 = clip._8_8_;
  uVar3 = clip._0_8_;
  if (list != (nk_draw_list *)0x0) {
    clip_local._8_8_ = nk_buffer_alloc(list->buffer,NK_BUFFER_BACK,0x20,8);
    if ((undefined4 *)clip_local._8_8_ == (undefined4 *)0x0) {
      clip_local.w = 0.0;
      clip_local.h = 0.0;
    }
    else {
      if (list->cmd_count == 0) {
        pvVar1 = nk_buffer_memory(list->buffer);
        nVar2 = nk_buffer_total(list->buffer);
        list->cmd_offset = (long)pvVar1 + (nVar2 - clip_local._8_8_);
      }
      *(undefined4 *)clip_local._8_8_ = 0;
      *(undefined8 *)(clip_local._8_8_ + 4) = uVar3;
      *(undefined8 *)(clip_local._8_8_ + 0xc) = uVar4;
      *(nk_handle *)(clip_local._8_8_ + 0x18) = texture;
      list->cmd_count = list->cmd_count + 1;
      (list->clip_rect).x = (float)(int)uVar3;
      (list->clip_rect).y = (float)(int)((ulong)uVar3 >> 0x20);
      (list->clip_rect).w = (float)(int)uVar4;
      (list->clip_rect).h = (float)(int)((ulong)uVar4 >> 0x20);
    }
    return (nk_draw_command *)clip_local._8_8_;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1ee8,
                "struct nk_draw_command *nk_draw_list_push_command(struct nk_draw_list *, struct nk_rect, nk_handle)"
               );
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_push_command(struct nk_draw_list *list, struct nk_rect clip,
    nk_handle texture)
{
    NK_STORAGE const nk_size cmd_align = NK_ALIGNOF(struct nk_draw_command);
    NK_STORAGE const nk_size cmd_size = sizeof(struct nk_draw_command);
    struct nk_draw_command *cmd;

    NK_ASSERT(list);
    cmd = (struct nk_draw_command*)
        nk_buffer_alloc(list->buffer, NK_BUFFER_BACK, cmd_size, cmd_align);

    if (!cmd) return 0;
    if (!list->cmd_count) {
        nk_byte *memory = (nk_byte*)nk_buffer_memory(list->buffer);
        nk_size total = nk_buffer_total(list->buffer);
        memory = nk_ptr_add(nk_byte, memory, total);
        list->cmd_offset = (nk_size)(memory - (nk_byte*)cmd);
    }

    cmd->elem_count = 0;
    cmd->clip_rect = clip;
    cmd->texture = texture;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    cmd->userdata = list->userdata;
#endif

    list->cmd_count++;
    list->clip_rect = clip;
    return cmd;
}